

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_constants_obj_make(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  undefined2 uVar5;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  if (wVar1 < L'\0') {
    pVar3 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar2 = strcmp(__s1,"max-depth");
    uVar5 = (undefined2)wVar1;
    if (iVar2 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x82) = uVar5;
    }
    else {
      iVar2 = strcmp(__s1,"great-obj");
      if (iVar2 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x84) = uVar5;
      }
      else {
        iVar2 = strcmp(__s1,"great-ego");
        if (iVar2 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x86) = uVar5;
        }
        else {
          iVar2 = strcmp(__s1,"fuel-torch");
          if (iVar2 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x88) = uVar5;
          }
          else {
            iVar2 = strcmp(__s1,"fuel-lamp");
            if (iVar2 == 0) {
              *(undefined2 *)((long)pvVar4 + 0x8a) = uVar5;
            }
            else {
              iVar2 = strcmp(__s1,"default-lamp");
              if (iVar2 != 0) {
                return PARSE_ERROR_UNDEFINED_DIRECTIVE;
              }
              *(undefined2 *)((long)pvVar4 + 0x8c) = uVar5;
            }
          }
        }
      }
    }
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_constants_obj_make(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "max-depth"))
		z->max_obj_depth = value;
	else if (streq(label, "great-obj"))
		z->great_obj = value;
	else if (streq(label, "great-ego"))
		z->great_ego = value;
	else if (streq(label, "fuel-torch"))
		z->fuel_torch = value;
	else if (streq(label, "fuel-lamp"))
		z->fuel_lamp = value;
	else if (streq(label, "default-lamp"))
		z->default_lamp = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}